

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysqlhs.c
# Opt level: O2

int test_(void)

{
  mysqlhs_context *c;
  char *__format;
  
  c = mysqlhs_connect("127.0.0.1",9999);
  if (c == (mysqlhs_context *)0x0) {
    __format = "failed to connect";
  }
  else {
    mysqlhs_execute(c,"P\t0\ttest\tmovie\tPRIMARY\tid,genre,title,view_count\n");
    if (c->result == 0) {
      printf("%s",c->data);
      mysqlhs_execute(c,"0\t+\t3\t0\tSci-Fi\tStar wars\n");
      if (c->result == 0) {
        printf("%s",c->data);
        mysqlhs_execute(c,"0\t>\t1\t0\t10\t0\n");
        if (c->result == 0) {
          printf("%s",c->data);
          mysqlhs_close(c);
          getchar();
          return 0;
        }
        __format = "failed to select";
      }
      else {
        __format = "failed to insert";
      }
    }
    else {
      __format = "failed to open";
    }
  }
  printf(__format);
  return 1;
}

Assistant:

int test_()
{
	mysqlhs_init();
	atexit(mysqlhs_end);

	mysqlhs_context* c = mysqlhs_connect("127.0.0.1", 9999);
	if (c == NULL)
	{
		printf("failed to connect");
		return 1;
	}

	mysqlhs_execute(c, "P	0	test	movie	PRIMARY	id,genre,title,view_count\n");
	if (c->result != MYSQL_HS_OK)
	{
		printf("failed to open");
		return 1;
	}
	printf("%s", c->data);

	mysqlhs_execute(c, "0	+	3	0	Sci-Fi	Star wars\n");
	if (c->result != MYSQL_HS_OK)
	{
		printf("failed to insert");
		return 1;
	}
	printf("%s", c->data);

	mysqlhs_execute(c, "0	>	1	0	10	0\n");
	if (c->result != MYSQL_HS_OK)
	{
		printf("failed to select");
		return 1;
	}
	printf("%s", c->data);
	
	mysqlhs_close(c);
	
	int z = getchar();
	return 0;
}